

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithBufferDataCase::testWithBufferSize
          (ModifyAfterWithBufferDataCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          *result,int bufferSize)

{
  RenderContext *pRVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  deUint64 dVar4;
  deUint64 dVar5;
  int iVar6;
  bool bVar7;
  
  pRVar1 = ((this->
            super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ).
            super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            .super_TestCase.m_context)->m_renderCtx;
  iVar2 = (*pRVar1->_vptr_RenderContext[3])(pRVar1,result,(long)(bufferSize * 3) % 4 & 0xffffffff);
  uVar3 = (int)((float)bufferSize * this->m_sizeDifferenceFactor) + 0xfU & 0xfffffff0;
  if (this->m_respecifySize == false) {
    uVar3 = bufferSize;
  }
  if (this->m_repeatedUpload != false) {
    iVar6 = 2;
    while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x150))
                (0x8892,(long)(int)uVar3,
                 (this->
                 super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (this->
                 super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ).m_bufferUsage);
      ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
      ::drawBufferRange(&this->
                         super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        ,bufferSize / 4 + 0xfU & 0xfffffff0,(bufferSize * 3) / 4 + 0xfU & 0xfffffff0
                       );
    }
  }
  dVar4 = deGetMicroseconds();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x150))
            (0x8892,(long)(int)uVar3,
             (this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).m_bufferUsage);
  dVar5 = deGetMicroseconds();
  (result->duration).totalDuration = dVar5 - dVar4;
  (result->duration).fitResponseDuration = dVar5 - dVar4;
  result->writtenSize = uVar3;
  return;
}

Assistant:

void ModifyAfterWithBufferDataCase::testWithBufferSize (UploadSampleResult<SingleOperationDuration>& result, int bufferSize)
{
	// always draw the same amount to make compares between cases sensible
	const int					drawStart			= deAlign32(bufferSize / 4, 4*4);
	const int					drawEnd				= deAlign32(bufferSize * 3 / 4, 4*4);

	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const int					largerBufferSize	= deAlign32((int)((float)bufferSize * m_sizeDifferenceFactor), 4*4);
	const int					newBufferSize		= (m_respecifySize) ? (largerBufferSize) : (bufferSize);
	deUint64					startTime;
	deUint64					endTime;

	// repeat upload-draw
	if (m_repeatedUpload)
	{
		for (int repeatNdx = 0; repeatNdx < NUM_REPEATS; ++repeatNdx)
		{
			gl.bufferData(GL_ARRAY_BUFFER, newBufferSize, &m_zeroData[0], m_bufferUsage);
			drawBufferRange(drawStart, drawEnd);
		}
	}

	// test upload
	startTime = deGetMicroseconds();
	gl.bufferData(GL_ARRAY_BUFFER, newBufferSize, &m_zeroData[0], m_bufferUsage);
	endTime = deGetMicroseconds();

	result.duration.totalDuration = endTime - startTime;
	result.duration.fitResponseDuration = result.duration.totalDuration;
	result.writtenSize = newBufferSize;
}